

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase475::run(TestCase475 *this)

{
  ReaderOptions *this_00;
  bool bVar1;
  Type *func;
  ArrayPtr<const_capnp::word> data_00;
  bool local_205;
  bool _kj_shouldLog;
  TestInputStream *local_1f8;
  ReaderOptions *local_1f0;
  undefined1 local_1e8 [8];
  Maybe<kj::Exception> e;
  ReaderOptions options;
  undefined1 local_58 [8];
  TestInputStream input;
  AlignedData<4> data;
  TestCase475 *this_local;
  
  input.lazy = false;
  input._25_7_ = 0x3000000;
  join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::word>((word *)&input.lazy,4);
  data_00 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&options.nestingLimit);
  TestInputStream::TestInputStream((TestInputStream *)local_58,data_00,false);
  this_00 = (ReaderOptions *)((long)&e.ptr.field_1 + 0x150);
  ReaderOptions::ReaderOptions(this_00);
  e.ptr.field_1._336_8_ = 2;
  local_1f8 = (TestInputStream *)local_58;
  local_1f0 = this_00;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase475::run()::__0>
            ((Maybe<kj::Exception> *)local_1e8,(kj *)&local_1f8,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=((Maybe<kj::Exception> *)local_1e8,(void *)0x0);
  if (!bVar1) {
    local_205 = kj::_::Debug::shouldLog(ERROR);
    while (local_205 != false) {
      kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
                 ,0x1ec,ERROR,
                 "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
                 (char (*) [30])"failed: expected e != nullptr",
                 (char (*) [33])"Should have thrown an exception.");
      local_205 = false;
    }
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_1e8);
  TestInputStream::~TestInputStream((TestInputStream *)local_58);
  return;
}

Assistant:

TEST(Serialize, RejectHugeMessage) {
  // A message whose root struct contains two words of data!
  AlignedData<4> data = {{0,0,0,0,3,0,0,0, 0,0,0,0,2,0,0,0, 0,0,0,0,0,0,0,0, 0,0,0,0,0,0,0,0}};

  TestInputStream input(kj::arrayPtr(data.words, 4), false);

  // We'll set the traversal limit to 2 words so our 3-word message is too big.
  ReaderOptions options;
  options.traversalLimitInWords = 2;

  kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
    InputStreamMessageReader reader(input, options);
#if !KJ_NO_EXCEPTIONS
    ADD_FAILURE() << "Should have thrown an exception.";
#endif
  });

  KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
}